

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILPSolver.cpp
# Opt level: O3

void __thiscall CILPSolver::PrepareCoeffBuffer(CILPSolver *this,int iNumCoeff,int iNumVariable)

{
  undefined1 auVar1 [16];
  int iVar2;
  double *pdVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  long lVar11;
  
  if (iNumCoeff == 0) {
    __assert_fail("iNumCoeff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/ILPSolver.cpp"
                  ,0x1ed,"void CILPSolver::PrepareCoeffBuffer(int, int)");
  }
  if (this->m_iNumCoeff < iNumCoeff) {
    if (this->m_pCoeff != (double *)0x0) {
      operator_delete__(this->m_pCoeff);
      this->m_pCoeff = (double *)0x0;
    }
    if (this->m_pCoeffIndex != (int *)0x0) {
      operator_delete__(this->m_pCoeffIndex);
      this->m_pCoeffIndex = (int *)0x0;
    }
    this->m_iNumCoeff = iNumCoeff;
    uVar6 = (long)iNumCoeff * 8 + 8;
    if (iNumCoeff < -1) {
      uVar6 = 0xffffffffffffffff;
    }
    uVar7 = (long)iNumCoeff * 4 + 4;
    if (iNumCoeff < -1) {
      uVar7 = 0xffffffffffffffff;
    }
    pdVar3 = (double *)operator_new__(uVar6);
    this->m_pCoeff = pdVar3;
    piVar4 = (int *)operator_new__(uVar7);
    this->m_pCoeffIndex = piVar4;
  }
  auVar1 = _DAT_0016c6c0;
  if (iNumVariable != 0) {
    if (-1 < iNumCoeff) {
      pdVar3 = this->m_pCoeff;
      auVar8._4_4_ = 0;
      auVar8._0_4_ = iNumCoeff;
      auVar8._8_4_ = iNumCoeff;
      auVar8._12_4_ = 0;
      lVar5 = 0;
      auVar8 = auVar8 ^ _DAT_0016c6c0;
      auVar10 = _DAT_0016c6b0;
      do {
        auVar13 = auVar10 ^ auVar1;
        if ((bool)(~(auVar13._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar13._0_4_ ||
                    auVar8._4_4_ < auVar13._4_4_) & 1)) {
          *(undefined8 *)((long)pdVar3 + lVar5) = 0x3ff0000000000000;
        }
        if ((auVar13._12_4_ != auVar8._12_4_ || auVar13._8_4_ <= auVar8._8_4_) &&
            auVar13._12_4_ <= auVar8._12_4_) {
          *(undefined8 *)((long)pdVar3 + lVar5 + 8) = 0x3ff0000000000000;
        }
        lVar11 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar11 + 2;
        lVar5 = lVar5 + 0x10;
      } while ((ulong)((uint)iNumCoeff >> 1 & 0x3fffffff) * 0x10 + 0x10 != lVar5);
    }
    auVar8 = _DAT_0016dc60;
    auVar10 = _DAT_0016c6c0;
    auVar1 = _DAT_0016c6b0;
    iVar2 = iNumVariable - iNumCoeff;
    if (iVar2 + 2 <= iNumVariable) {
      piVar4 = this->m_pCoeffIndex;
      lVar5 = (ulong)(uint)iNumCoeff - 2;
      auVar13._8_4_ = (int)lVar5;
      auVar13._0_8_ = lVar5;
      auVar13._12_4_ = (int)((ulong)lVar5 >> 0x20);
      uVar6 = 0;
      auVar13 = auVar13 ^ _DAT_0016c6c0;
      do {
        iVar12 = (int)uVar6;
        auVar14._8_4_ = iVar12;
        auVar14._0_8_ = uVar6;
        auVar14._12_4_ = (int)(uVar6 >> 0x20);
        auVar15 = (auVar14 | auVar1) ^ auVar10;
        iVar9 = auVar13._4_4_;
        if ((bool)(~(auVar15._4_4_ == iVar9 && auVar13._0_4_ < auVar15._0_4_ ||
                    iVar9 < auVar15._4_4_) & 1)) {
          piVar4[uVar6 + 1] = iVar2 + iVar12 + 2;
        }
        if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
            auVar15._12_4_ <= auVar13._12_4_) {
          piVar4[uVar6 + 2] = iVar2 + iVar12 + 3;
        }
        auVar14 = (auVar14 | auVar8) ^ auVar10;
        iVar16 = auVar14._4_4_;
        if (iVar16 <= iVar9 && (iVar16 != iVar9 || auVar14._0_4_ <= auVar13._0_4_)) {
          piVar4[uVar6 + 3] = iVar2 + iVar12 + 4;
          piVar4[uVar6 + 4] = iVar2 + iVar12 + 5;
        }
        uVar6 = uVar6 + 4;
      } while (((ulong)(uint)iNumCoeff + 2 & 0xfffffffffffffffc) != uVar6);
    }
  }
  return;
}

Assistant:

void CILPSolver::PrepareCoeffBuffer(int iNumCoeff, int iNumVariable)
{
	assert(iNumCoeff);

	if(iNumCoeff>m_iNumCoeff)
	{
		SAFE_DELA(m_pCoeff);
		SAFE_DELA(m_pCoeffIndex);

		m_iNumCoeff		=	iNumCoeff;
		m_pCoeff		=	new	double[m_iNumCoeff+1];
		m_pCoeffIndex	=	new	int[m_iNumCoeff+1];

		assert(m_pCoeff);
		assert(m_pCoeffIndex);
	}

	if(iNumVariable)
	{
		for(int i=0;i<iNumCoeff+1;++i)	m_pCoeff[i]	=	1;
		for(int iIndex=1,i=iNumVariable-iNumCoeff+2;i<=iNumVariable;++i)	m_pCoeffIndex[iIndex++]	=	i;		
	}

#ifdef _DEBUG
	m_pCoeffIndex[0]			=	-99;
	m_pCoeffIndex[m_iNumCoeff]	=	-99;
	m_pCoeff[0]					=	-99;
	m_pCoeff[m_iNumCoeff]		=	-99;
#endif
}